

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

bool __thiscall
SuffixTree::GeneralizedSuffixTree::AddSymbol(GeneralizedSuffixTree *this,char symbol)

{
  mapped_type *pmVar1;
  size_type sVar2;
  unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
  *this_00;
  uint local_1c;
  
  if (symbol != '\0') {
    this_00 = &this->active_node->edges;
    if (this->active_length == 0) {
      local_1c = (int)symbol;
      sVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&this_00->_M_h,&local_1c);
      if (sVar2 != 0) {
        this->active_edge = (int)symbol;
        goto LAB_00105a48;
      }
    }
    else {
      pmVar1 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&this->active_edge);
      if ((this->strings).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[pmVar1->string_number]._M_dataplus._M_p
          [this->active_length + pmVar1->start] == symbol) {
LAB_00105a48:
        IncActiveLength(this);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GeneralizedSuffixTree::AddSymbol (char symbol)
{
    if (!symbol)
        return false;
    if (active_length)
    {
        // active point is on edge
        Edge &edge = active_node->edges[active_edge];
        if (strings[edge.string_number][edge.start + active_length] == symbol)
        {
            IncActiveLength();
            return true;
        }
        else
            return false;
    }
    else
    {
        // active point is on node
        if (active_node->edges.count (static_cast<uint> (symbol)))
        {
            active_edge = static_cast<uint> (symbol);
            IncActiveLength();
            return true;
        }
        else
            return false;
    }
}